

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

bool ConvexDecomposition::ComputeHull
               (uint vcount,float *vertices,PHullResult *result,uint vlimit,float inflate)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int3 t;
  int *faces;
  int local_74;
  int verts_count_out;
  int index_count;
  int *tris_out;
  undefined8 uStack_60;
  ulong local_50;
  PHullResult *local_48;
  uint *local_40;
  float3 *verts_out;
  
  if ((inflate != 0.0) || (NAN(inflate))) {
    iVar3 = overhullv((float3 *)vertices,vcount,0x23,&verts_out,&verts_count_out,&faces,&index_count
                      ,inflate,120.0,vlimit);
    if (iVar3 != 0) {
      tris_out = (int *)0x0;
      uStack_60._0_4_ = 0;
      uStack_60._4_4_ = 0;
      puVar2 = (uint *)CONCAT44(faces._4_4_,(uint)faces);
      local_50 = (ulong)*puVar2;
      local_48 = result;
      if (0 < (int)*puVar2) {
        iVar5 = 0;
        iVar3 = 1;
        do {
          iVar4 = iVar3 + 1;
          uVar1 = puVar2[iVar3];
          local_74 = iVar5;
          if (2 < (long)(int)uVar1) {
            local_40 = puVar2 + iVar4;
            lVar6 = 2;
            do {
              t.y = puVar2[iVar3 + (int)lVar6];
              t.x = puVar2[iVar4];
              t.z = local_40[lVar6];
              Array<ConvexDecomposition::int3>::Add((Array<ConvexDecomposition::int3> *)&tris_out,t)
              ;
              lVar6 = lVar6 + 1;
            } while ((int)uVar1 != lVar6);
          }
          iVar3 = uVar1 + iVar4;
          iVar5 = local_74 + 1;
        } while (iVar5 != (int)local_50);
      }
      if ((uint)uStack_60 != ~((int)local_50 * 3) + index_count) {
        __assert_fail("tris.count == index_count-1-(n*3)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                      ,0xabe,
                      "bool ConvexDecomposition::ComputeHull(unsigned int, const float *, PHullResult &, unsigned int, float)"
                     );
      }
      local_48->mIndexCount = (uint)uStack_60 * 3;
      local_48->mFaceCount = (uint)uStack_60;
      local_48->mVertices = &verts_out->x;
      local_48->mVcount = verts_count_out;
      local_48->mIndices = (uint *)tris_out;
      iVar3 = 1;
    }
  }
  else {
    iVar3 = calchull((float3 *)vertices,vcount,&tris_out,(int *)&faces,vlimit);
    if (iVar3 != 0) {
      result->mIndexCount = (uint)faces * 3;
      result->mFaceCount = (uint)faces;
      result->mVertices = vertices;
      result->mVcount = vcount;
      result->mIndices = (uint *)tris_out;
    }
  }
  return SUB41(iVar3,0);
}

Assistant:

bool ComputeHull(unsigned int vcount,const float *vertices,PHullResult &result,unsigned int vlimit,float inflate)
{

	int index_count;
	int *faces;
	float3 *verts_out;
	int     verts_count_out;

	if(inflate==0.0f)
	{
		int  *tris_out;
		int    tris_count;
		int ret = calchull( (float3 *) vertices, (int) vcount, tris_out, tris_count, vlimit );
		if(!ret) return false;
		result.mIndexCount = (unsigned int) (tris_count*3);
		result.mFaceCount  = (unsigned int) tris_count;
		result.mVertices   = (float*) vertices;
		result.mVcount     = (unsigned int) vcount;
		result.mIndices    = (unsigned int *) tris_out;
		return true;
	}

	int ret = overhullv((float3*)vertices,vcount,35,verts_out,verts_count_out,faces,index_count,inflate,120.0f,vlimit);
	if(!ret) return false;

	Array<int3> tris;
	int n=faces[0];
	int k=1;
	for(int i=0;i<n;i++)
	{
		int pn = faces[k++];
		for(int j=2;j<pn;j++) tris.Add(int3(faces[k],faces[k+j-1],faces[k+j]));
		k+=pn;
	}
	assert(tris.count == index_count-1-(n*3));

	result.mIndexCount = (unsigned int) (tris.count*3);
	result.mFaceCount  = (unsigned int) tris.count;
	result.mVertices   = (float*) verts_out;
	result.mVcount     = (unsigned int) verts_count_out;
	result.mIndices    = (unsigned int *) tris.element;
	tris.element=NULL; tris.count = tris.array_size=0;

	return true;
}